

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O0

void * bad_thread(void *voidargs)

{
  fdb_kvs_handle *handle;
  long lVar1;
  fdb_status fVar2;
  long in_RDI;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_doc doc;
  fdb_status s;
  fdb_iterator *itr;
  fdb_kvs_handle *db;
  shared_data *data;
  undefined7 in_stack_ffffffffffffff38;
  fdb_iterator_seek_opt_t in_stack_ffffffffffffff3f;
  size_t in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff48;
  fdb_iterator *in_stack_ffffffffffffff50;
  timeval local_88;
  size_t local_78;
  fdb_doc *in_stack_ffffffffffffff90;
  fdb_kvs_handle *handle_00;
  fdb_doc *in_stack_ffffffffffffffa0;
  fdb_kvs_handle *handle_01;
  
  handle = *(fdb_kvs_handle **)(in_RDI + 8);
  lVar1 = *(long *)(in_RDI + 0x10);
  gettimeofday(&local_88,(__timezone_ptr_t)0x0);
  memset(&stack0xffffffffffffff88,0,0x50);
  handle_01 = (fdb_kvs_handle *)&stack0xffffffffffffff88;
  local_78 = 2;
  handle_00 = (fdb_kvs_handle *)0x2;
  if (lVar1 == 0) {
    fVar2 = fdb_set(handle,(fdb_doc *)&stack0xffffffffffffff88);
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x15f);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x15f,"void *bad_thread(void *)");
      }
    }
    fVar2 = fdb_del(handle_00,in_stack_ffffffffffffff90);
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x161);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x161,"void *bad_thread(void *)");
      }
    }
    fVar2 = fdb_get(handle,(fdb_doc *)&stack0xffffffffffffff88);
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x163);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x163,"void *bad_thread(void *)");
      }
    }
    fVar2 = fdb_get_metaonly(handle,(fdb_doc *)&stack0xffffffffffffff88);
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x165);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x165,"void *bad_thread(void *)");
      }
    }
    fVar2 = fdb_get_byseq(handle,(fdb_doc *)&stack0xffffffffffffff88);
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x167);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x167,"void *bad_thread(void *)");
      }
    }
    fVar2 = fdb_get_metaonly_byseq(handle,(fdb_doc *)&stack0xffffffffffffff88);
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x169);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x169,"void *bad_thread(void *)");
      }
    }
    fVar2 = fdb_get_byoffset(handle_01,in_stack_ffffffffffffffa0);
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x16c);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x16c,"void *bad_thread(void *)");
      }
    }
  }
  else {
    fVar2 = fdb_iterator_next((fdb_iterator *)
                              CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x16f);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x16f,"void *bad_thread(void *)");
      }
    }
    fVar2 = fdb_iterator_prev((fdb_iterator *)
                              CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x171);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x171,"void *bad_thread(void *)");
      }
    }
    fVar2 = fdb_iterator_seek_to_min
                      ((fdb_iterator *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)
                      );
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x173);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x173,"void *bad_thread(void *)");
      }
    }
    fVar2 = fdb_iterator_seek_to_max
                      ((fdb_iterator *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)
                      );
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x175);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x175,"void *bad_thread(void *)");
      }
    }
    fVar2 = fdb_iterator_seek(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                              in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
    if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x177);
      bad_thread::__test_pass = 0;
      if (fVar2 != FDB_RESULT_HANDLE_BUSY) {
        __assert_fail("s == FDB_RESULT_HANDLE_BUSY",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x177,"void *bad_thread(void *)");
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *bad_thread(void *voidargs) {
    struct shared_data *data = (struct shared_data *)voidargs;
    fdb_kvs_handle *db = data->db;
    fdb_iterator *itr = data->iterator;
    fdb_status s;
    fdb_doc doc;
    TEST_INIT();

    memset(&doc, 0, sizeof(fdb_doc));
    doc.key = &doc; // some non-null value
    doc.keylen = 2; // some non-zero value
    doc.body = &doc; // some non-null value
    doc.bodylen = 2; // some non-zero value

    if (!itr) {
        // since the parent thread is hung in the fdb_set callback
        // all the forestdb apis calls on the same handle must return failure
        s = fdb_set(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_del(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_metaonly(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_byseq(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_get_metaonly_byseq(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        doc.offset = 5000; // some random non-zero value
        s = fdb_get_byoffset(db, &doc);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
    } else {
        s = fdb_iterator_next(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_prev(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek_to_min(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek_to_max(itr);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
        s = fdb_iterator_seek(itr, doc.key, doc.keylen, 0);
        TEST_CHK(s == FDB_RESULT_HANDLE_BUSY);
    }

    return NULL;
}